

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O2

size_t __thiscall
pstack::Procman::CoreProcess::getRegs
          (CoreProcess *this,lwpid_t lwpid,int code,size_t size,void *data)

{
  pointer pNVar1;
  bool bVar2;
  iterator iVar3;
  ulong uVar4;
  int iVar5;
  size_t __n;
  _Base_ptr p_Var6;
  long lVar7;
  long lVar8;
  undefined1 local_1b8 [8];
  elf_prstatus prstatus;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  lwpid_t local_54;
  long lStack_50;
  lwpid_t lwpid_local;
  size_t local_48;
  void *local_40;
  int local_34;
  
  local_54 = lwpid;
  local_34 = code;
  iVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
          ::find(&(this->lwpToPrStatusIdx)._M_t,&local_54);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header) {
LAB_0012d19a:
    __n = 0;
  }
  else {
    p_Var6 = iVar3._M_node[1]._M_parent;
    lVar8 = (long)p_Var6 * -0x20;
    iVar5 = local_34;
    lVar7 = (long)p_Var6 * 0x20;
    local_48 = size;
    local_40 = data;
    while( true ) {
      p_Var6 = (_Base_ptr)((long)&p_Var6->_M_color + 1);
      pNVar1 = (this->notes).
               super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&(pNVar1->note).n_type + lVar7) == iVar5) break;
      if (p_Var6 == (_Base_ptr)
                    ((long)(this->notes).
                           super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 5))
      goto LAB_0012d19a;
      if (*(int *)((long)&pNVar1[1].note.n_type + lVar7) == 1) {
        lStack_50 = lVar8;
        pstack::Elf::NoteDesc::name_abi_cxx11_();
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1b8,"CORE");
        lVar8 = lStack_50;
        std::__cxx11::string::~string((string *)local_1b8);
        iVar5 = local_34;
        if (bVar2) goto LAB_0012d19a;
      }
      lVar8 = lVar8 + -0x20;
      lVar7 = lVar7 + 0x20;
    }
    if (iVar5 == 1) {
      pstack::Elf::NoteDesc::data();
      Reader::readObj<elf_prstatus>((elf_prstatus *)local_1b8,(Reader *)prstatus._328_8_,0);
      __n = local_48;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      if (0xd7 < __n) {
        __n = 0xd8;
      }
      memcpy(local_40,&prstatus.pr_cstime.tv_usec,__n);
    }
    else {
      pstack::Elf::NoteDesc::data();
      uVar4 = (**(code **)(*(long *)local_1b8 + 0x40))();
      __n = local_48;
      if (uVar4 < local_48) {
        __n = uVar4;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&prstatus);
      pstack::Elf::NoteDesc::data();
      (**(code **)(*(long *)local_1b8 + 0x10))(local_1b8,0,__n,local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&prstatus);
    }
  }
  return __n;
}

Assistant:

size_t
CoreProcess::getRegs(lwpid_t lwpid, int code, size_t size, void *data)
{
   auto idx = lwpToPrStatusIdx.find( lwpid );
   if ( idx == lwpToPrStatusIdx.end() ) {
      return 0;
   }
   for (size_t i = idx->second;;) {
      if (notes[i].type() == code) {
         if (code == NT_PRSTATUS) {
            auto prstatus = notes[i].data()->readObj<prstatus_t>(0);
            size = std::min(size, sizeof prstatus.pr_reg);
            memcpy(data, &prstatus.pr_reg, size);
         } else {
            size = std::min(size, size_t(notes[i].data()->size()));
            notes[i].data()->read(0, size, reinterpret_cast<char *>(data));
         }
         return size;
      }
      ++i;
      if (i == notes.size() || ( notes[i].type() == NT_PRSTATUS && notes[i].name() == "CORE") ) {
         // We're done if that's all the notes, or the next note is the start of a new LWP.
         break;
      }
   }
   return 0;
}